

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_lib.cc
# Opt level: O0

bool bssl::dtls1_new(SSL *ssl)

{
  bool bVar1;
  pointer pDVar2;
  unique_ptr<bssl::DTLS1_STATE,_bssl::internal::Deleter> local_20;
  UniquePtr<DTLS1_STATE> d1;
  SSL *ssl_local;
  
  d1._M_t.super___uniq_ptr_impl<bssl::DTLS1_STATE,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bssl::DTLS1_STATE_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bssl::DTLS1_STATE_*,_false>._M_head_impl =
       (__uniq_ptr_data<bssl::DTLS1_STATE,_bssl::internal::Deleter,_true,_true>)
       (__uniq_ptr_data<bssl::DTLS1_STATE,_bssl::internal::Deleter,_true,_true>)ssl;
  bVar1 = tls_new(ssl);
  if (!bVar1) {
    return false;
  }
  MakeUnique<bssl::DTLS1_STATE>();
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_20);
  if (bVar1) {
    pDVar2 = std::unique_ptr<bssl::DTLS1_STATE,_bssl::internal::Deleter>::operator->(&local_20);
    bVar1 = DTLS1_STATE::Init(pDVar2);
    if (bVar1) {
      pDVar2 = std::unique_ptr<bssl::DTLS1_STATE,_bssl::internal::Deleter>::release(&local_20);
      *(pointer *)
       ((long)d1._M_t.super___uniq_ptr_impl<bssl::DTLS1_STATE,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_bssl::DTLS1_STATE_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_bssl::DTLS1_STATE_*,_false>._M_head_impl + 0x38) = pDVar2;
      ssl_local._7_1_ = true;
      goto LAB_001dceb7;
    }
  }
  tls_free((SSL *)d1._M_t.super___uniq_ptr_impl<bssl::DTLS1_STATE,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_bssl::DTLS1_STATE_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_bssl::DTLS1_STATE_*,_false>._M_head_impl);
  ssl_local._7_1_ = false;
LAB_001dceb7:
  std::unique_ptr<bssl::DTLS1_STATE,_bssl::internal::Deleter>::~unique_ptr(&local_20);
  return ssl_local._7_1_;
}

Assistant:

bool dtls1_new(SSL *ssl) {
  if (!tls_new(ssl)) {
    return false;
  }
  UniquePtr<DTLS1_STATE> d1 = MakeUnique<DTLS1_STATE>();
  if (!d1 || !d1->Init()) {
    tls_free(ssl);
    return false;
  }

  ssl->d1 = d1.release();
  return true;
}